

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

RABlock * __thiscall
asmjit::v1_14::BaseRAPass::newBlockOrExistingAt
          (BaseRAPass *this,LabelNode *cbLabel,BaseNode **stoppedAt)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  size_t nPendingLabels;
  RABlock *block;
  BaseNode *node;
  FuncNode *func;
  char *in_stack_00000300;
  int in_stack_0000030c;
  char *in_stack_00000310;
  long local_e8;
  BaseRAPass *this_00;
  undefined8 *puVar1;
  RABlock *local_b0;
  
  if (in_RSI[4] == 0) {
    this_00 = (BaseRAPass *)*in_RSI;
    local_b0 = (RABlock *)0x0;
    local_e8 = 0;
    for (; this_00 != (BaseRAPass *)0x0;
        this_00 = (BaseRAPass *)(this_00->super_FuncPass).super_Pass._vptr_Pass) {
      if (*(char *)&(this_00->super_FuncPass).super_Pass._name == '\x03') {
        if (this_00 == *(BaseRAPass **)(in_RDI + 0x98)) {
          DebugUtils::assertionFailed(in_stack_00000310,in_stack_0000030c,in_stack_00000300);
        }
        local_b0 = *(RABlock **)&this_00->field_0x20;
        if (local_b0 != (RABlock *)0x0) {
          if (this_00 == *(BaseRAPass **)&(*(BaseRAPass **)(in_RDI + 0x98))->field_0x338) {
            local_b0 = (RABlock *)0x0;
          }
          break;
        }
        local_e8 = local_e8 + 1;
      }
      else if (*(char *)&(this_00->super_FuncPass).super_Pass._name != '\x04') break;
    }
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = this_00;
    }
    if ((local_b0 == (RABlock *)0x0) &&
       (local_b0 = newBlock(this_00,(BaseNode *)0x0), local_b0 == (RABlock *)0x0)) {
      local_b0 = (RABlock *)0x0;
    }
    else {
      in_RSI[4] = local_b0;
      puVar1 = in_RSI;
      for (; local_e8 != 0; local_e8 = local_e8 + -1) {
        puVar1 = (undefined8 *)*puVar1;
        while (*(char *)(puVar1 + 2) != '\x03') {
          puVar1 = (undefined8 *)*puVar1;
          if (puVar1 == (undefined8 *)0x0) {
            DebugUtils::assertionFailed(in_stack_00000310,in_stack_0000030c,in_stack_00000300);
          }
        }
        puVar1[4] = local_b0;
      }
      if (*(long *)(local_b0 + 0x10) == 0) {
        *(undefined8 **)(local_b0 + 0x10) = puVar1;
        *(undefined8 **)(local_b0 + 0x18) = in_RSI;
      }
    }
  }
  else {
    local_b0 = (RABlock *)in_RSI[4];
  }
  return local_b0;
}

Assistant:

RABlock* BaseRAPass::newBlockOrExistingAt(LabelNode* cbLabel, BaseNode** stoppedAt) noexcept {
  if (cbLabel->hasPassData())
    return cbLabel->passData<RABlock>();

  FuncNode* func = this->func();
  BaseNode* node = cbLabel->prev();
  RABlock* block = nullptr;

  // Try to find some label, but terminate the loop on any code. We try hard to coalesce code that contains two
  // consecutive labels or a combination of non-code nodes between 2 or more labels.
  //
  // Possible cases that would share the same basic block:
  //
  //   1. Two or more consecutive labels:
  //     Label1:
  //     Label2:
  //
  //   2. Two or more labels separated by non-code nodes:
  //     Label1:
  //     ; Some comment...
  //     .align 16
  //     Label2:
  size_t nPendingLabels = 0;

  while (node) {
    if (node->type() == NodeType::kLabel) {
      // Function has a different NodeType, just make sure this was not messed up as we must never associate
      // BasicBlock with a `func` itself.
      ASMJIT_ASSERT(node != func);

      block = node->passData<RABlock>();
      if (block) {
        // Exit node has always a block associated with it. If we went here it means that `cbLabel` passed here
        // is after the end of the function and cannot be merged with the function exit block.
        if (node == func->exitNode())
          block = nullptr;
        break;
      }

      nPendingLabels++;
    }
    else if (node->type() == NodeType::kAlign) {
      // Align node is fine.
    }
    else {
      break;
    }

    node = node->prev();
  }

  if (stoppedAt)
    *stoppedAt = node;

  if (!block) {
    block = newBlock();
    if (ASMJIT_UNLIKELY(!block))
      return nullptr;
  }

  cbLabel->setPassData<RABlock>(block);
  node = cbLabel;

  while (nPendingLabels) {
    node = node->prev();
    for (;;) {
      if (node->type() == NodeType::kLabel) {
        node->setPassData<RABlock>(block);
        nPendingLabels--;
        break;
      }

      node = node->prev();
      ASMJIT_ASSERT(node != nullptr);
    }
  }

  if (!block->first()) {
    block->setFirst(node);
    block->setLast(cbLabel);
  }

  return block;
}